

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall
aim_t::EnterSectorPortal
          (aim_t *this,int position,double frac,sector_t *entersec,DAngle *newtoppitch,
          DAngle *newbottompitch)

{
  char *pcVar1;
  bool bVar2;
  TVector2<double> local_1c0;
  TVector3<double> local_1b0;
  TVector2<double> local_198;
  undefined1 local_188 [40];
  undefined1 local_160 [8];
  aim_t newtrace;
  double portalz;
  DAngle *newbottompitch_local;
  DAngle *newtoppitch_local;
  sector_t *entersec_local;
  double frac_local;
  int position_local;
  aim_t *this_local;
  
  newtrace._280_8_ = sector_t::GetPortalPlaneZ(entersec,position);
  if (((position != 1) || (this->limitz <= (double)newtrace._280_8_)) &&
     ((position != 0 ||
      ((double)newtrace._280_8_ < this->limitz || (double)newtrace._280_8_ == this->limitz)))) {
    Clone((aim_t *)local_160,this);
    TAngle<double>::operator=((TAngle<double> *)&newtrace.aimtarget,newtoppitch);
    TAngle<double>::operator=(&newtrace.toppitch,newbottompitch);
    newtrace.lastceilingplane._0_4_ = 2;
    if (position == 1) {
      newtrace.lastceilingplane._0_4_ = 1;
    }
    sector_t::GetPortalDisplacement((sector_t *)local_188,(int)entersec);
    operator+((TVector3<double> *)(local_188 + 0x10),&this->startpos,(Vector2 *)local_188);
    TVector3<double>::operator=
              ((TVector3<double> *)&newtrace.aimdir,(TVector3<double> *)(local_188 + 0x10));
    newtrace.aimtrace.Y = frac + 1.0 / this->attackrange;
    ::operator*(&local_1c0,newtrace.aimtrace.Y);
    operator+(&local_1b0,(TVector3<double> *)&newtrace.aimdir,&local_1c0);
    TVector2<double>::TVector2(&local_198,&local_1b0);
    newtrace._192_8_ = P_PointInSector(&local_198);
    newtrace.shootz = (double)newtrace._280_8_;
    bVar2 = FBoolCVar::operator_cast_to_bool(&aimdebug);
    if (bVar2) {
      pcVar1 = "Alphafloor";
      if (position != 0) {
        pcVar1 = "Alphaceiling";
      }
      Printf("-----Entering %s portal from sector %d to sector %d\n",pcVar1 + 5,
             (ulong)(uint)this->lastsector->sectornum,(ulong)*(uint *)(newtrace._192_8_ + 0x1fc));
    }
    AimTraverse((aim_t *)local_160);
    SetResult(this,&this->linetarget,(AimTarget *)&newtrace.bottompitch);
    SetResult(this,&this->thing_friend,(AimTarget *)&newtrace.linetarget.frac);
    SetResult(this,&this->thing_other,(AimTarget *)&newtrace.thing_friend.frac);
    bVar2 = FBoolCVar::operator_cast_to_bool(&aimdebug);
    if (bVar2) {
      pcVar1 = "Alphafloor";
      if (position != 0) {
        pcVar1 = "Alphaceiling";
      }
      Printf("-----Exiting %s portal\n",pcVar1 + 5);
    }
  }
  return;
}

Assistant:

void EnterSectorPortal(int position, double frac, sector_t *entersec, DAngle newtoppitch, DAngle newbottompitch)
	{
		double portalz = entersec->GetPortalPlaneZ(position);

		if (position == sector_t::ceiling && portalz < limitz) return;
		else if (position == sector_t::floor && portalz > limitz) return;
		aim_t newtrace = Clone();


		newtrace.toppitch = newtoppitch;
		newtrace.bottompitch = newbottompitch;
		newtrace.aimdir = position == sector_t::ceiling? aim_t::aim_up : aim_t::aim_down;
		newtrace.startpos = startpos + entersec->GetPortalDisplacement(position);
		newtrace.startfrac = frac + 1. / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening
		newtrace.lastsector = P_PointInSector(newtrace.startpos + aimtrace * newtrace.startfrac);
		newtrace.limitz = portalz;
		if (aimdebug)
			Printf("-----Entering %s portal from sector %d to sector %d\n", position ? "ceiling" : "floor", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
		if (aimdebug)
			Printf("-----Exiting %s portal\n", position ? "ceiling" : "floor");
	}